

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void * generate_func_code(MIR_context_t ctx,MIR_item_t func_item,int machine_code_p)

{
  FILE *pFVar1;
  double dVar2;
  size_t sVar3;
  int iVar4;
  gen_ctx_t *ppgVar5;
  char *pcVar6;
  void *pvVar7;
  size_t sVar8;
  double dVar9;
  double dVar10;
  uint32_t bbs_num;
  double start_time;
  size_t code_len;
  void *machine_code;
  uint8_t *code;
  gen_ctx_t gen_ctx;
  MIR_item_t pMStack_20;
  int machine_code_p_local;
  MIR_item_t func_item_local;
  MIR_context_t ctx_local;
  
  gen_ctx._4_4_ = machine_code_p;
  pMStack_20 = func_item;
  func_item_local = (MIR_item_t)ctx;
  ppgVar5 = gen_ctx_loc(ctx);
  code = (uint8_t *)*ppgVar5;
  code_len = 0;
  start_time = 0.0;
  dVar9 = real_usec_time();
  if ((pMStack_20->item_type == MIR_func_item) && (pMStack_20->data == (void *)0x0)) {
    if (((pMStack_20->u).func)->machine_code == (void *)0x0) {
      if ((*(long *)(code + 0x18) != 0) && (-1 < *(int *)(code + 0x20))) {
        pFVar1 = *(FILE **)(code + 0x18);
        pcVar6 = MIR_item_name((MIR_context_t)func_item_local,pMStack_20);
        fprintf(pFVar1,"Code generation of function %s:\n",pcVar6);
      }
      if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
        fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR before generator:\n");
        MIR_output_item((MIR_context_t)func_item_local,*(FILE **)(code + 0x18),pMStack_20);
      }
      *(MIR_item_t *)(code + 0x10) = pMStack_20;
      _MIR_duplicate_func_insns((MIR_context_t)func_item_local,pMStack_20);
      pvVar7 = gen_malloc((gen_ctx_t)code,0x30);
      pMStack_20->data = pvVar7;
      *(void **)(code + 0x108) = pvVar7;
      build_func_cfg((gen_ctx_t)code);
      if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
        fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after building CFG:\n");
        print_CFG((gen_ctx_t)code,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      if ((((1 < *(uint *)(code + 8)) && (*(int *)(code + 0x30) == 0)) &&
          (iVar4 = clone_bbs((gen_ctx_t)code), iVar4 != 0)) &&
         ((*(long *)(code + 0x18) != 0 && (1 < *(int *)(code + 0x20))))) {
        fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after cloning BBs:\n");
        print_CFG((gen_ctx_t)code,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      if (((1 < *(uint *)(code + 8)) &&
          (build_ssa((gen_ctx_t)code,(uint)((*(int *)(code + 0x30) != 0 ^ 0xffU) & 1)),
          *(long *)(code + 0x18) != 0)) && (1 < *(int *)(code + 0x20))) {
        pcVar6 = "";
        if (*(int *)(code + 0x30) != 0) {
          pcVar6 = " for address transformation";
        }
        fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after building SSA%s:\n",pcVar6);
        print_varr_insns((gen_ctx_t)code,"undef init",
                         *(VARR_bb_insn_t **)(*(long *)(code + 0x148) + 8));
        print_varr_insns((gen_ctx_t)code,"arg init",
                         (VARR_bb_insn_t *)**(undefined8 **)(code + 0x148));
        fprintf(*(FILE **)(code + 0x18),"\n");
        print_CFG((gen_ctx_t)code,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      if ((1 < *(uint *)(code + 8)) && (*(int *)(code + 0x30) != 0)) {
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++Transform Addr Insns and cloning BBs:\n");
        }
        transform_addrs((gen_ctx_t)code);
        undo_build_ssa((gen_ctx_t)code);
        clone_bbs((gen_ctx_t)code);
        build_ssa((gen_ctx_t)code,1);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),
                  "+++++++++++++MIR after Addr Insns Transformation and cloning BBs:\n");
          print_varr_insns((gen_ctx_t)code,"undef init",
                           *(VARR_bb_insn_t **)(*(long *)(code + 0x148) + 8));
          print_varr_insns((gen_ctx_t)code,"arg init",
                           (VARR_bb_insn_t *)**(undefined8 **)(code + 0x148));
          fprintf(*(FILE **)(code + 0x18),"\n");
          print_CFG((gen_ctx_t)code,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
      }
      if (1 < *(uint *)(code + 8)) {
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++GVN:\n");
        }
        gvn((gen_ctx_t)code);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after GVN:\n");
          print_CFG((gen_ctx_t)code,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
        gvn_clear((gen_ctx_t)code);
      }
      if (1 < *(uint *)(code + 8)) {
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++Copy Propagation:\n");
        }
        copy_prop((gen_ctx_t)code);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after Copy Propagation:\n");
          print_CFG((gen_ctx_t)code,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
      }
      if (1 < *(uint *)(code + 8)) {
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++DSE:\n");
        }
        dse((gen_ctx_t)code);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after DSE:\n");
          print_CFG((gen_ctx_t)code,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
      }
      if (((1 < *(uint *)(code + 8)) &&
          (ssa_dead_code_elimination((gen_ctx_t)code), *(long *)(code + 0x18) != 0)) &&
         (1 < *(int *)(code + 0x20))) {
        fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after dead code elimination:\n");
        print_CFG((gen_ctx_t)code,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      if (1 < *(uint *)(code + 8)) {
        build_loop_tree((gen_ctx_t)code);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          print_loop_tree((gen_ctx_t)code,1);
        }
        iVar4 = licm((gen_ctx_t)code);
        if (((iVar4 != 0) && (*(long *)(code + 0x18) != 0)) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after loop invariant motion:\n");
          print_CFG((gen_ctx_t)code,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
        destroy_loop_tree((gen_ctx_t)code,*(loop_node_t_conflict *)(*(long *)(code + 0x108) + 0x28))
        ;
        *(undefined8 *)(*(long *)(code + 0x108) + 0x28) = 0;
      }
      if ((((1 < *(uint *)(code + 8)) && (iVar4 = pressure_relief((gen_ctx_t)code), iVar4 != 0)) &&
          (*(long *)(code + 0x18) != 0)) && (1 < *(int *)(code + 0x20))) {
        fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after pressure relief:\n");
        print_CFG((gen_ctx_t)code,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      if (1 < *(uint *)(code + 8)) {
        make_conventional_ssa((gen_ctx_t)code);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),
                  "+++++++++++++MIR after transformation to conventional SSA:\n");
          print_CFG((gen_ctx_t)code,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
        ssa_combine((gen_ctx_t)code);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after ssa combine:\n");
          print_CFG((gen_ctx_t)code,1,1,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
        undo_build_ssa((gen_ctx_t)code);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after destroying ssa:\n");
          print_varr_insns((gen_ctx_t)code,"undef init",
                           *(VARR_bb_insn_t **)(*(long *)(code + 0x148) + 8));
          print_varr_insns((gen_ctx_t)code,"arg init",
                           (VARR_bb_insn_t *)**(undefined8 **)(code + 0x148));
          fprintf(*(FILE **)(code + 0x18),"\n");
          print_CFG((gen_ctx_t)code,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
      }
      if (1 < *(uint *)(code + 8)) {
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++Jump optimization:\n");
        }
        jump_opt((gen_ctx_t)code);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after Jump optimization:\n");
          print_CFG((gen_ctx_t)code,1,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
      }
      target_machinize((gen_ctx_t)code);
      make_io_dup_op_insns((gen_ctx_t)code);
      if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
        fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after machinize:\n");
        print_CFG((gen_ctx_t)code,0,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      if (((*(int *)(code + 8) != 0) &&
          (build_loop_tree((gen_ctx_t)code), *(long *)(code + 0x18) != 0)) &&
         (1 < *(int *)(code + 0x20))) {
        print_loop_tree((gen_ctx_t)code,1);
      }
      if (1 < *(uint *)(code + 8)) {
        collect_moves((gen_ctx_t)code);
        iVar4 = consider_move_vars_only((gen_ctx_t)code);
        if (iVar4 != 0) {
          calculate_func_cfg_live_info((gen_ctx_t)code,0);
          print_live_info((gen_ctx_t)code,"Live info before coalesce",1,0);
          coalesce((gen_ctx_t)code);
          if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
            fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after coalescing:\n");
            print_CFG((gen_ctx_t)code,1,1,1,1,output_bb_border_live_info);
          }
        }
      }
      consider_all_live_vars((gen_ctx_t)code);
      calculate_func_cfg_live_info((gen_ctx_t)code,1);
      print_live_info((gen_ctx_t)code,"Live info before RA",(uint)(*(int *)(code + 8) != 0),1);
      reg_alloc((gen_ctx_t)code);
      if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
        fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after RA:\n");
        print_CFG((gen_ctx_t)code,1,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      if ((*(uint *)(code + 8) < 2) && (gen_ctx._4_4_ != 0)) {
        remove_property_insns((gen_ctx_t)code);
      }
      if (*(int *)(code + 8) != 0) {
        consider_all_live_vars((gen_ctx_t)code);
        calculate_func_cfg_live_info((gen_ctx_t)code,0);
        add_bb_insn_dead_vars((gen_ctx_t)code);
        print_live_info((gen_ctx_t)code,"Live info before combine",0,0);
        combine((gen_ctx_t)code,gen_ctx._4_4_);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),"+++++++++++++MIR after combine:\n");
          print_CFG((gen_ctx_t)code,0,0,1,0,(_func_void_gen_ctx_t_bb_t *)0x0);
        }
        dead_code_elimination((gen_ctx_t)code);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          fprintf(*(FILE **)(code + 0x18),
                  "+++++++++++++MIR after dead code elimination after 2nd combine:\n");
          print_CFG((gen_ctx_t)code,1,1,1,0,output_bb_live_info);
        }
      }
      target_make_prolog_epilog
                ((gen_ctx_t)code,*(bitmap_t *)(code + 0x100),*(size_t *)(code + 0x1d0));
      target_split_insns((gen_ctx_t)code);
      if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
        fprintf(*(FILE **)(code + 0x18),
                "+++++++++++++MIR after forming prolog/epilog and insn splitting:\n");
        print_CFG((gen_ctx_t)code,0,0,1,1,(_func_void_gen_ctx_t_bb_t *)0x0);
      }
      if (gen_ctx._4_4_ != 0) {
        machine_code = target_translate((gen_ctx_t)code,(size_t *)&start_time);
        code_len = (size_t)_MIR_publish_code((MIR_context_t)func_item_local,(uint8_t *)machine_code,
                                             (size_t)start_time);
        ((pMStack_20->u).func)->call_addr = (void *)code_len;
        target_rebase((gen_ctx_t)code,(uint8_t *)((pMStack_20->u).func)->call_addr);
        if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
          _MIR_dump_code((char *)0x0,(uint8_t *)code_len,(size_t)start_time);
          fprintf(*(FILE **)(code + 0x18),"code size = %lu:\n",start_time);
        }
        _MIR_redirect_thunk((MIR_context_t)func_item_local,pMStack_20->addr,
                            ((pMStack_20->u).func)->call_addr);
      }
      if (*(int *)(code + 8) != 0) {
        destroy_loop_tree((gen_ctx_t)code,*(loop_node_t_conflict *)(*(long *)(code + 0x108) + 0x28))
        ;
      }
      destroy_func_cfg((gen_ctx_t)code);
      if (gen_ctx._4_4_ == 0) {
        ctx_local = (MIR_context_t)0x0;
      }
      else {
        if ((*(long *)(code + 0x18) != 0) && (-1 < *(int *)(code + 0x20))) {
          pFVar1 = *(FILE **)(code + 0x18);
          pcVar6 = MIR_item_name((MIR_context_t)func_item_local,pMStack_20);
          sVar8 = DLIST_MIR_insn_t_length(&((pMStack_20->u).func)->insns);
          sVar3 = code_len;
          dVar2 = start_time;
          dVar10 = real_usec_time();
          fprintf(pFVar1,
                  "  Code generation for %s: %lu MIR insns (addr=%llx, len=%lu) -- time %.2f ms\n",
                  (dVar10 - dVar9) / 1000.0,pcVar6,sVar8,sVar3,dVar2);
        }
        _MIR_restore_func_insns((MIR_context_t)func_item_local,pMStack_20);
        ((pMStack_20->u).func)->machine_code = (void *)code_len;
        ctx_local = (MIR_context_t)pMStack_20->addr;
      }
    }
    else {
      if (((pMStack_20->u).func)->call_addr == (void *)0x0) {
        __assert_fail("func_item->u.func->call_addr != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x2410,"void *generate_func_code(MIR_context_t, MIR_item_t, int)");
      }
      _MIR_redirect_thunk((MIR_context_t)func_item_local,pMStack_20->addr,
                          ((pMStack_20->u).func)->call_addr);
      if ((*(long *)(code + 0x18) != 0) && (1 < *(int *)(code + 0x20))) {
        pFVar1 = *(FILE **)(code + 0x18);
        pcVar6 = MIR_item_name((MIR_context_t)func_item_local,pMStack_20);
        fprintf(pFVar1,"+++++++++++++The code for %s has been already generated\n",pcVar6);
      }
      ctx_local = (MIR_context_t)pMStack_20->addr;
    }
    return ctx_local;
  }
  __assert_fail("func_item->item_type == MIR_func_item && func_item->data == ((void*)0)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x240e,"void *generate_func_code(MIR_context_t, MIR_item_t, int)");
}

Assistant:

static void *generate_func_code (MIR_context_t ctx, MIR_item_t func_item, int machine_code_p) {
  gen_ctx_t gen_ctx = *gen_ctx_loc (ctx);
  uint8_t *code;
  void *machine_code = NULL;
  size_t code_len = 0;
  double start_time = real_usec_time ();
  uint32_t bbs_num;

  gen_assert (func_item->item_type == MIR_func_item && func_item->data == NULL);
  if (func_item->u.func->machine_code != NULL) {
    gen_assert (func_item->u.func->call_addr != NULL);
    _MIR_redirect_thunk (ctx, func_item->addr, func_item->u.func->call_addr);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++The code for %s has been already generated\n",
               MIR_item_name (ctx, func_item));
    });
    return func_item->addr;
  }
  DEBUG (0, {
    fprintf (debug_file, "Code generation of function %s:\n", MIR_item_name (ctx, func_item));
  });
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR before generator:\n");
    MIR_output_item (ctx, debug_file, func_item);
  });
  curr_func_item = func_item;
  _MIR_duplicate_func_insns (ctx, func_item);
  curr_cfg = func_item->data = gen_malloc (gen_ctx, sizeof (struct func_cfg));
  build_func_cfg (gen_ctx);
  bbs_num = curr_bb_index;
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after building CFG:\n");
    print_CFG (gen_ctx, TRUE, FALSE, TRUE, FALSE, NULL);
  });
  if (optimize_level >= 2 && !addr_insn_p && clone_bbs (gen_ctx)) {
    /* do not clone bbs before addr transformation: it can prevent addr transformations */
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after cloning BBs:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, FALSE, NULL);
    });
  }
  if (optimize_level >= 2) {
    build_ssa (gen_ctx, !addr_insn_p);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after building SSA%s:\n",
               addr_insn_p ? " for address transformation" : "");
      print_varr_insns (gen_ctx, "undef init", undef_insns);
      print_varr_insns (gen_ctx, "arg init", arg_bb_insns);
      fprintf (debug_file, "\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2 && addr_insn_p) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++Transform Addr Insns and cloning BBs:\n"); });
    transform_addrs (gen_ctx);
    undo_build_ssa (gen_ctx);
    clone_bbs (gen_ctx);
    build_ssa (gen_ctx, TRUE);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after Addr Insns Transformation and cloning BBs:\n");
      print_varr_insns (gen_ctx, "undef init", undef_insns);
      print_varr_insns (gen_ctx, "arg init", arg_bb_insns);
      fprintf (debug_file, "\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++GVN:\n"); });
    gvn (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after GVN:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
    gvn_clear (gen_ctx);
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++Copy Propagation:\n"); });
    copy_prop (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after Copy Propagation:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++DSE:\n"); });
    dse (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after DSE:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    ssa_dead_code_elimination (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after dead code elimination:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    build_loop_tree (gen_ctx);
    DEBUG (2, { print_loop_tree (gen_ctx, TRUE); });
    if (licm (gen_ctx)) {
      DEBUG (2, {
        fprintf (debug_file, "+++++++++++++MIR after loop invariant motion:\n");
        print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
      });
    }
    destroy_loop_tree (gen_ctx, curr_cfg->root_loop_node);
    curr_cfg->root_loop_node = NULL;
  }
  if (optimize_level >= 2 && pressure_relief (gen_ctx)) {
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after pressure relief:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    make_conventional_ssa (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after transformation to conventional SSA:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
    ssa_combine (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after ssa combine:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, NULL);
    });
    undo_build_ssa (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after destroying ssa:\n");
      print_varr_insns (gen_ctx, "undef init", undef_insns);
      print_varr_insns (gen_ctx, "arg init", arg_bb_insns);
      fprintf (debug_file, "\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  if (optimize_level >= 2) {
    DEBUG (2, { fprintf (debug_file, "+++++++++++++Jump optimization:\n"); });
    jump_opt (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after Jump optimization:\n");
      print_CFG (gen_ctx, TRUE, FALSE, TRUE, TRUE, NULL);
    });
  }
  target_machinize (gen_ctx);
  make_io_dup_op_insns (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after machinize:\n");
    print_CFG (gen_ctx, FALSE, FALSE, TRUE, TRUE, NULL);
  });
  if (optimize_level >= 1) {
    build_loop_tree (gen_ctx);
    DEBUG (2, { print_loop_tree (gen_ctx, TRUE); });
  }
  if (optimize_level >= 2) {
    collect_moves (gen_ctx);
    if (consider_move_vars_only (gen_ctx)) {
      calculate_func_cfg_live_info (gen_ctx, FALSE);
      print_live_info (gen_ctx, "Live info before coalesce", TRUE, FALSE);
      coalesce (gen_ctx);
      DEBUG (2, {
        fprintf (debug_file, "+++++++++++++MIR after coalescing:\n");
        print_CFG (gen_ctx, TRUE, TRUE, TRUE, TRUE, output_bb_border_live_info);
      });
    }
  }
  consider_all_live_vars (gen_ctx);
  calculate_func_cfg_live_info (gen_ctx, TRUE);
  print_live_info (gen_ctx, "Live info before RA", optimize_level > 0, TRUE);
  reg_alloc (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after RA:\n");
    print_CFG (gen_ctx, TRUE, FALSE, TRUE, FALSE, NULL);
  });
  if (optimize_level < 2 && machine_code_p) remove_property_insns (gen_ctx);
  if (optimize_level >= 1) {
    consider_all_live_vars (gen_ctx);
    calculate_func_cfg_live_info (gen_ctx, FALSE);
    add_bb_insn_dead_vars (gen_ctx);
    print_live_info (gen_ctx, "Live info before combine", FALSE, FALSE);
    combine (gen_ctx, machine_code_p); /* After combine the BB live info is still valid */
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after combine:\n");
      print_CFG (gen_ctx, FALSE, FALSE, TRUE, FALSE, NULL);
    });
    dead_code_elimination (gen_ctx);
    DEBUG (2, {
      fprintf (debug_file, "+++++++++++++MIR after dead code elimination after 2nd combine:\n");
      print_CFG (gen_ctx, TRUE, TRUE, TRUE, FALSE, output_bb_live_info);
    });
  }
  target_make_prolog_epilog (gen_ctx, func_used_hard_regs, func_stack_slots_num);
  target_split_insns (gen_ctx);
  DEBUG (2, {
    fprintf (debug_file, "+++++++++++++MIR after forming prolog/epilog and insn splitting:\n");
    print_CFG (gen_ctx, FALSE, FALSE, TRUE, TRUE, NULL);
  });
  if (machine_code_p) {
    code = target_translate (gen_ctx, &code_len);
    machine_code = func_item->u.func->call_addr = _MIR_publish_code (ctx, code, code_len);
    target_rebase (gen_ctx, func_item->u.func->call_addr);
#if MIR_GEN_CALL_TRACE
    func_item->u.func->call_addr = _MIR_get_wrapper (ctx, func_item, print_and_execute_wrapper);
#endif
    DEBUG (2, {
      _MIR_dump_code (NULL, machine_code, code_len);
      fprintf (debug_file, "code size = %lu:\n", (unsigned long) code_len);
    });
    _MIR_redirect_thunk (ctx, func_item->addr, func_item->u.func->call_addr);
  }
  if (optimize_level != 0) destroy_loop_tree (gen_ctx, curr_cfg->root_loop_node);
  destroy_func_cfg (gen_ctx);
  if (collect_bb_stat_p) overall_bbs_num += bbs_num;
  if (!machine_code_p) return NULL;
  DEBUG (0, {
    fprintf (debug_file,
             "  Code generation for %s: %lu MIR insns (addr=%llx, len=%lu) -- time %.2f ms\n",
             MIR_item_name (ctx, func_item),
             (long unsigned) DLIST_LENGTH (MIR_insn_t, func_item->u.func->insns),
             (unsigned long long) machine_code, (unsigned long) code_len,
             (real_usec_time () - start_time) / 1000.0);
  });
  _MIR_restore_func_insns (ctx, func_item);
  /* ??? We should use atomic here but c2mir does not implement them yet.  */
  func_item->u.func->machine_code = machine_code;
  return func_item->addr;
}